

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O0

string * __thiscall OpenMD::Revision::getHalfRevision_abi_cxx11_(Revision *this)

{
  string *in_RDI;
  string *fr;
  Revision *in_stack_ffffffffffffff58;
  string local_88 [32];
  string local_68 [16];
  Revision *in_stack_ffffffffffffffa8;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  getVersion_abi_cxx11_(in_stack_ffffffffffffff58);
  std::__cxx11::string::assign((string *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::append((char *)in_RDI);
  getRevision_abi_cxx11_(in_stack_ffffffffffffffa8);
  std::__cxx11::string::substr((ulong)local_68,(ulong)local_88);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::append((char *)in_RDI);
  getBuildDate_abi_cxx11_(in_stack_ffffffffffffff58);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  return in_RDI;
}

Assistant:

std::string Revision::getHalfRevision() {
    std::string fr;
    fr.assign(getVersion());
    fr.append("  ");
    fr.append(getRevision().substr(0, 17));
    fr.append("   ");
    fr.append(getBuildDate());
    return fr;
  }